

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
* __thiscall
phmap::priv::
node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
::operator=(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
            *this,node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                  *other)

{
  bool bVar1;
  allocator<int> *__args;
  allocator_type *alloc;
  slot_type *new_slot;
  slot_type *old_slot;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  *other_local;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  *this_local;
  
  destroy(this);
  bVar1 = empty(other);
  if (!bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)other);
    if (bVar1) {
      __args = std::optional<std::allocator<int>_>::value(&other->alloc_);
      std::optional<std::allocator<int>>::emplace<std::allocator<int>&>
                ((optional<std::allocator<int>> *)this,__args);
    }
    alloc = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
            ::alloc(this);
    new_slot = slot(this);
    old_slot = slot(other);
    hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
    transfer<std::allocator<int>>(alloc,new_slot,old_slot);
    reset(other);
  }
  return this;
}

Assistant:

node_handle_base& operator=(node_handle_base&& other) noexcept {
        destroy();
        if (!other.empty()) {
            if (other.alloc_) {
               alloc_.emplace(other.alloc_.value());
            }
            PolicyTraits::transfer(alloc(), slot(), other.slot());
            other.reset();
        }
        return *this;
    }